

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  unsigned_long uVar1;
  pointer pcVar2;
  byte bVar3;
  pointer pbVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  cmake *pcVar7;
  ulong uVar8;
  long lVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  ParseMode parseState;
  string buffer;
  string value;
  ParseMode local_ec;
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  char *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  unsigned_long *local_68;
  string *local_60;
  cmake **local_58;
  string local_50;
  
  local_ec = 0;
  switch(*(int *)(this + 0x60)) {
  case 0:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      local_ec = 2;
      goto switchD_003932cc_default;
    }
    local_c8._0_8_ = local_c8 + 0x10;
    local_c8._8_8_ = (cmake *)0x0;
    local_c8._16_8_ = (ulong)(uint7)local_c8._17_7_ << 8;
    local_e8._0_8_ = *state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_e8);
    goto LAB_00393570;
  case 1:
  case 3:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_c8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_ec);
      if (local_ec == 0) {
        local_e8._0_8_ = *state;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_e8);
        goto LAB_0039370f;
      }
      goto LAB_00393718;
    }
    uVar8 = *index + 1;
    pbVar4 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((uVar8 < (ulong)((long)(allArgs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) &&
       (*pbVar4[uVar8]._M_dataplus._M_p != '-')) {
      local_c8._0_8_ = *state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar3 = (**(code **)(this + 0x80))(this + 0x68,pbVar4 + uVar8,local_c8);
      local_ec = (ParseMode)(bVar3 ^ 1);
      *index = uVar8;
      goto switchD_003932cc_default;
    }
    if (*(int *)(this + 0x60) != 3) goto LAB_003935d7;
    local_c8._0_8_ = local_c8 + 0x10;
    local_c8._8_8_ = (cmake *)0x0;
    local_c8._16_8_ = (ulong)(uint7)local_c8._17_7_ << 8;
    local_e8._0_8_ = *state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_e8);
LAB_00393570:
    local_ec = (ParseMode)(bVar3 ^ 1);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._16_8_;
    pcVar7 = (cmake *)local_c8._0_8_;
    if ((cmake *)local_c8._0_8_ == (cmake *)(local_c8 + 0x10)) goto switchD_003932cc_default;
    break;
  case 2:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) goto switchD_003932cc_default;
    uVar1 = *index;
    uVar8 = uVar1 + 2;
    pbVar4 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((((ulong)((long)(allArgs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar8)
        || (*pbVar4[uVar1 + 1]._M_dataplus._M_p == '-')) || (*pbVar4[uVar8]._M_dataplus._M_p == '-')
       ) {
LAB_003935d7:
      local_ec = 3;
      goto switchD_003932cc_default;
    }
    *index = uVar8;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
              ((string *)local_c8,pbVar4 + uVar1 + 1,(char (*) [2])0x89ce43,pbVar4 + uVar8);
    local_e8._0_8_ = *state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_e8);
LAB_0039370f:
    local_ec = (ParseMode)(bVar3 ^ 1);
LAB_00393718:
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._16_8_;
    pcVar7 = (cmake *)local_c8._0_8_;
    if ((cmake *)local_c8._0_8_ == (cmake *)(local_c8 + 0x10)) goto switchD_003932cc_default;
    break;
  case 4:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_c8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_ec);
      if (local_ec != 0) goto LAB_00393718;
      local_e8._0_8_ = *state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_e8);
      goto LAB_0039370f;
    }
    uVar1 = *index;
    uVar8 = uVar1 + 1;
    pbVar4 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(allArgs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar8) ||
       (*pbVar4[uVar8]._M_dataplus._M_p == '-')) goto LAB_003935d7;
    uVar5 = uVar1 + 2;
    local_e8._0_8_ = local_e8 + 0x10;
    pcVar2 = pbVar4[uVar8]._M_dataplus._M_p;
    local_68 = index;
    local_60 = input;
    local_58 = state;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar2,pcVar2 + pbVar4[uVar8]._M_string_length);
    pbVar4 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(allArgs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) {
      lVar9 = uVar1 * 0x20 + 0x40;
      do {
        if (**(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar9) == '-') break;
        local_c8._0_8_ = local_e8._8_8_;
        local_c8._8_8_ = local_e8._0_8_;
        local_c8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_c8._24_8_ = &DAT_00000001;
        local_a8 = ";";
        local_a0 = 0;
        local_90 = *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar9);
        local_98 = *(undefined1 **)((long)&pbVar4->_M_string_length + lVar9);
        local_88 = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_c8;
        cmCatViews(&local_50,views);
        std::__cxx11::string::operator=((string *)local_e8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
        }
        uVar5 = uVar5 + 1;
        pbVar4 = (allArgs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x20;
      } while (uVar5 < (ulong)((long)(allArgs->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
    }
    local_c8._0_8_ = *local_58;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (**(code **)(this + 0x80))(this + 0x68,local_e8,local_c8);
    local_ec = (ParseMode)(bVar3 ^ 1);
    *local_68 = uVar5 - 1;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._16_8_;
    pcVar7 = (cmake *)local_e8._0_8_;
    input = local_60;
    if ((cmake *)local_e8._0_8_ == (cmake *)(local_e8 + 0x10)) goto switchD_003932cc_default;
    break;
  default:
    goto switchD_003932cc_default;
  }
  operator_delete(pcVar7,(ulong)((long)&(pbVar6->_M_dataplus)._M_p + 1));
switchD_003932cc_default:
  if (local_ec == 3) {
    cmSystemTools::Error((string *)(this + 0x20));
  }
  else if (local_ec == 2) {
    local_c8._0_8_ = &DAT_00000001;
    local_c8._8_8_ = "\'";
    local_c8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = (input->_M_dataplus)._M_p;
    local_c8._24_8_ = input->_M_string_length;
    local_a0 = 0;
    local_98 = &DAT_00000001;
    local_90 = "\'";
    local_88 = 0;
    local_78 = *(undefined8 *)this;
    local_80 = *(undefined8 *)(this + 8);
    local_70 = 0;
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_c8;
    cmCatViews((string *)local_e8,views_00);
    cmSystemTools::Error((string *)local_e8);
    if ((cmake *)local_e8._0_8_ != (cmake *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
  }
  return local_ec == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }